

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O3

SampledSpectrum __thiscall
pbrt::MarbleTexture::Evaluate(MarbleTexture *this,TextureEvalContext ctx,SampledWavelengths lambda)

{
  float fVar1;
  Float FVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined1 auVar7 [16];
  int iVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [12];
  undefined1 in_ZMM3 [64];
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  SampledSpectrum SVar23;
  Point3f PVar24;
  undefined1 local_e8 [16];
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 uStack_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined4 local_80;
  RGB local_78;
  Tuple3<pbrt::Point3,_float> local_68;
  Tuple3<pbrt::Vector3,_float> local_58;
  Tuple3<pbrt::Vector3,_float> local_48;
  RGBReflectanceSpectrum local_38;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  
  local_48.x = 0.0;
  local_48.y = 0.0;
  local_58.x = 0.0;
  local_58.y = 0.0;
  local_48.z = 0.0;
  local_58.z = 0.0;
  auVar18 = in_ZMM3._4_12_;
  PVar24 = TransformMapping3D::Map
                     ((TransformMapping3D *)
                      ((this->mapping).super_TaggedPointer<pbrt::TransformMapping3D>.bits &
                      0xffffffffffff),ctx,(Vector3f *)&local_48,(Vector3f *)&local_58);
  fVar1 = this->scale;
  auVar9._0_4_ = fVar1 * PVar24.super_Tuple3<pbrt::Point3,_float>.x;
  auVar9._4_4_ = fVar1 * PVar24.super_Tuple3<pbrt::Point3,_float>.y;
  auVar9._8_4_ = fVar1 * ctx.p.super_Tuple3<pbrt::Point3,_float>.z;
  auVar9._12_4_ = fVar1 * ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.x;
  local_68._0_8_ = vmovlps_avx(auVar9);
  local_68.z = PVar24.super_Tuple3<pbrt::Point3,_float>.z * fVar1;
  FVar2 = this->variation;
  auVar10._0_4_ = fVar1 * local_48.x;
  auVar10._4_4_ = fVar1 * local_48.y;
  auVar10._8_4_ = fVar1 * 0.0;
  auVar10._12_4_ = fVar1 * 0.0;
  local_e8._0_8_ = vmovlps_avx(auVar10);
  local_e8._8_4_ = fVar1 * local_48.z;
  local_38.rgb.g = fVar1 * local_58.z;
  auVar11._0_4_ = fVar1 * local_58.x;
  auVar11._4_4_ = fVar1 * local_58.y;
  auVar11._8_4_ = fVar1 * 0.0;
  auVar11._12_4_ = fVar1 * 0.0;
  local_38._0_8_ = vmovlps_avx(auVar11);
  auVar14._0_4_ =
       FBm((Point3f *)&local_68,(Vector3f *)local_e8,(Vector3f *)&local_38,this->omega,this->octaves
          );
  auVar14._4_60_ = extraout_var;
  auVar9 = vmovshdup_avx(auVar9);
  auVar9 = vfmadd132ss_fma(auVar14._0_16_,auVar9,ZEXT416((uint)FVar2));
  auVar15._0_4_ = sinf(auVar9._0_4_);
  auVar15._4_60_ = extraout_var_00;
  auVar10 = vfmadd213ss_fma(SUB6416(ZEXT464(0x3f000000),0),auVar15._0_16_,
                            SUB6416(ZEXT464(0x3f000000),0));
  local_e8._0_4_ = 0.58;
  local_e8._4_4_ = 0.58;
  local_e8._8_8_ = 0x3f147ae13f19999a;
  uStack_d8 = 0x3f19999a3f147ae1;
  uStack_d0 = 0x3f147ae13f147ae1;
  uStack_c8 = 0x3f0000003f19999a;
  uStack_c0 = 0x3f0000003f000000;
  uStack_b8 = 0x3f170a3d3f19999a;
  uStack_b0 = 0x3f147ae13f147ae1;
  local_a8 = 0x3f19999a3f147ae1;
  uStack_a0 = 0x3f147ae13f147ae1;
  uStack_98 = 0x3e4ccccd3f19999a;
  uStack_90 = 0x3ea8f5c33e4ccccd;
  auVar12._8_4_ = 0x3f147ae1;
  auVar12._0_8_ = 0x3f147ae13f147ae1;
  auVar12._12_4_ = 0x3f147ae1;
  local_88 = vmovlps_avx(auVar12);
  local_80 = 0x3f19999a;
  auVar9 = ZEXT416((uint)(auVar10._0_4_ * 6.0));
  auVar9 = vroundss_avx(auVar9,auVar9,9);
  iVar8 = 5;
  if ((int)auVar9._0_4_ < 5) {
    iVar8 = (int)auVar9._0_4_;
  }
  auVar17._0_4_ = (float)iVar8;
  auVar17._4_12_ = auVar18;
  auVar9 = vfmsub231ss_fma(auVar17,SUB6416(ZEXT464(0x40c00000),0),auVar10);
  fVar16 = auVar9._0_4_;
  fVar6 = 1.0 - fVar16;
  fVar1 = fVar6 * *(float *)(local_e8 + (long)(iVar8 + 1) * 0xc + 8) +
          fVar16 * *(float *)(local_e8 + (long)(iVar8 + 2) * 0xc + 8);
  local_78.b = (fVar6 * (fVar6 * (fVar6 * *(float *)(local_e8 + (long)iVar8 * 0xc + 8) +
                                 fVar16 * *(float *)(local_e8 + (long)(iVar8 + 1) * 0xc + 8)) +
                        fVar16 * fVar1) +
               fVar16 * (fVar6 * fVar1 +
                        fVar16 * (fVar6 * *(float *)(local_e8 + (long)(iVar8 + 2) * 0xc + 8) +
                                 fVar16 * *(float *)(local_e8 + (long)(iVar8 + 3) * 0xc + 8)))) *
               1.5;
  fVar1 = (float)*(undefined8 *)(local_e8 + (long)(iVar8 + 1) * 0xc);
  fVar4 = (float)((ulong)*(undefined8 *)(local_e8 + (long)(iVar8 + 1) * 0xc) >> 0x20);
  fVar3 = (float)*(undefined8 *)(local_e8 + (long)(iVar8 + 2) * 0xc);
  fVar5 = (float)((ulong)*(undefined8 *)(local_e8 + (long)(iVar8 + 2) * 0xc) >> 0x20);
  fVar19 = fVar6 * fVar1 + fVar16 * fVar3;
  fVar20 = fVar6 * fVar4 + fVar16 * fVar5;
  fVar21 = fVar6 * 0.0 + fVar16 * 0.0;
  fVar22 = fVar6 * 0.0 + fVar16 * 0.0;
  auVar13._0_4_ =
       fVar16 * (fVar6 * fVar19 +
                fVar16 * (fVar6 * fVar3 +
                         fVar16 * (float)*(undefined8 *)(local_e8 + (long)(iVar8 + 3) * 0xc))) +
       fVar6 * (fVar16 * fVar19 +
               fVar6 * (fVar6 * (float)*(undefined8 *)(local_e8 + (long)iVar8 * 0xc) +
                       fVar16 * fVar1));
  auVar13._4_4_ =
       fVar16 * (fVar6 * fVar20 +
                fVar16 * (fVar6 * fVar5 +
                         fVar16 * (float)((ulong)*(undefined8 *)(local_e8 + (long)(iVar8 + 3) * 0xc)
                                         >> 0x20))) +
       fVar6 * (fVar16 * fVar20 +
               fVar6 * (fVar6 * (float)((ulong)*(undefined8 *)(local_e8 + (long)iVar8 * 0xc) >> 0x20
                                       ) + fVar16 * fVar4));
  auVar13._8_4_ =
       fVar16 * (fVar6 * fVar21 + fVar16 * (fVar6 * 0.0 + fVar16 * 0.0)) +
       fVar6 * (fVar16 * fVar21 + fVar6 * (fVar6 * 0.0 + fVar16 * 0.0));
  auVar13._12_4_ =
       fVar16 * (fVar6 * fVar22 + fVar16 * (fVar6 * 0.0 + fVar16 * 0.0)) +
       fVar6 * (fVar16 * fVar22 + fVar6 * (fVar6 * 0.0 + fVar16 * 0.0));
  auVar7._8_4_ = 0x3fc00000;
  auVar7._0_8_ = 0x3fc000003fc00000;
  auVar7._12_4_ = 0x3fc00000;
  auVar9 = vmulps_avx512vl(auVar13,auVar7);
  local_78._0_8_ = vmovlps_avx(auVar9);
  RGBReflectanceSpectrum::RGBReflectanceSpectrum(&local_38,RGBColorSpace::sRGB,&local_78);
  SVar23 = RGBReflectanceSpectrum::Sample(&local_38,&lambda);
  return (array<float,_4>)(array<float,_4>)SVar23;
}

Assistant:

SampledSpectrum MarbleTexture::Evaluate(TextureEvalContext ctx,
                                        SampledWavelengths lambda) const {
    Vector3f dpdx, dpdy;
    Point3f p = mapping.Map(ctx, &dpdx, &dpdy);
    p *= scale;
    Float marble = p.y + variation * FBm(p, scale * dpdx, scale * dpdy, omega, octaves);
    Float t = .5f + .5f * std::sin(marble);
    // Evaluate marble spline at _t_
    const RGB c[] = {
        {.58f, .58f, .6f}, {.58f, .58f, .6f}, {.58f, .58f, .6f},
        {.5f, .5f, .5f},   {.6f, .59f, .58f}, {.58f, .58f, .6f},
        {.58f, .58f, .6f}, {.2f, .2f, .33f},  {.58f, .58f, .6f},
    };
    int nSeg = PBRT_ARRAYSIZE(c) - 3;
    int first = std::min<int>(std::floor(t * nSeg), nSeg - 1);
    t = (t * nSeg - first);
    // Bezier spline evaluated with de Castilejau's algorithm
    RGB s0 = Lerp(t, c[first], c[first + 1]);
    RGB s1 = Lerp(t, c[first + 1], c[first + 2]);
    RGB s2 = Lerp(t, c[first + 2], c[first + 3]);
    s0 = Lerp(t, s0, s1);
    s1 = Lerp(t, s1, s2);
    // Extra scale of 1.5 to increase variation among colors
    s0 = 1.5f * Lerp(t, s0, s1);
#ifdef PBRT_IS_GPU_CODE
    return RGBReflectanceSpectrum(*RGBColorSpace_sRGB, s0).Sample(lambda);
#else
    return RGBReflectanceSpectrum(*RGBColorSpace::sRGB, s0).Sample(lambda);
#endif
}